

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O2

double FindMaxElevation(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *aos,DateTime *los)

{
  DateTime DVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  int64_t ticks;
  double dVar5;
  CoordTopocentric topo;
  Observer obs;
  Eci eci;
  double local_110;
  DateTime local_108;
  double local_100;
  CoordTopocentric local_f8;
  Observer local_d8;
  Eci local_78;
  
  libsgp4::Observer::Observer(&local_d8,user_geo);
  lVar2 = aos->m_encoded;
  local_100 = ((double)(los->m_encoded - lVar2) / 1000000.0) / 9.0;
  DVar1.m_encoded = los->m_encoded;
  do {
    dVar5 = local_100 * 1000000.0;
    bVar3 = true;
    local_110 = -99999999999999.0;
    local_108.m_encoded = lVar2;
    while ((bVar3 && (local_108.m_encoded < DVar1.m_encoded))) {
      libsgp4::SGP4::FindPosition(&local_78,sgp4,&local_108);
      libsgp4::Observer::GetLookAngle(&local_f8,&local_d8,&local_78);
      bVar3 = local_110 < local_f8.elevation;
      if (local_110 < local_f8.elevation) {
        local_108.m_encoded = local_108.m_encoded + (long)dVar5;
        if (DVar1.m_encoded <= local_108.m_encoded) {
          local_108.m_encoded = DVar1.m_encoded;
        }
        local_110 = local_f8.elevation;
      }
    }
    lVar4 = (long)(local_100 * -2.0 * 1000000.0);
    lVar2 = local_108.m_encoded + lVar4;
    local_100 = ((double)-lVar4 / 1000000.0) / 9.0;
    DVar1.m_encoded = local_108.m_encoded;
  } while (1.0 < local_100);
  return local_110;
}

Assistant:

double FindMaxElevation(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& aos,
        const libsgp4::DateTime& los)
{
    libsgp4::Observer obs(user_geo);

    bool running;

    double time_step = (los - aos).TotalSeconds() / 9.0;
    libsgp4::DateTime current_time(aos); //! current time
    libsgp4::DateTime time1(aos); //! start time of search period
    libsgp4::DateTime time2(los); //! end time of search period
    double max_elevation; //! max elevation

    running = true;

    do
    {
        running = true;
        max_elevation = -99999999999999.0;
        while (running && current_time < time2)
        {
            /*
             * find position
             */
            libsgp4::Eci eci = sgp4.FindPosition(current_time);
            libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

            if (topo.elevation > max_elevation)
            {
                /*
                 * still going up
                 */
                max_elevation = topo.elevation;
                /*
                 * move time along
                 */
                current_time = current_time.AddSeconds(time_step);
                if (current_time > time2)
                {
                    /*
                     * dont go past end time
                     */
                    current_time = time2;
                }
            }
            else
            {
                /*
                 * stop
                 */
                running = false;
            }
        }

        /*
         * make start time to 2 time steps back
         */
        time1 = current_time.AddSeconds(-2.0 * time_step);
        /*
         * make end time to current time
         */
        time2 = current_time;
        /*
         * current time to start time
         */
        current_time = time1;
        /*
         * recalculate time step
         */
        time_step = (time2 - time1).TotalSeconds() / 9.0;
    }
    while (time_step > 1.0);

    return max_elevation;
}